

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateMessageClearingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  file = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasFieldPresence(file);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "GOOGLE_DCHECK($name$_ != NULL);\n$name$_->$type$::Clear();\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "if (GetArenaNoVirtual() == NULL && $name$_ != NULL) {\n  delete $name$_;\n}\n$name$_ = NULL;\n"
                      );
  }
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateMessageClearingCode(io::Printer* printer) const {
  if (!HasFieldPresence(descriptor_->file())) {
    // If we don't have has-bits, message presence is indicated only by ptr !=
    // NULL. Thus on clear, we need to delete the object.
    printer->Print(variables_,
      "if (GetArenaNoVirtual() == NULL && $name$_ != NULL) {\n"
      "  delete $name$_;\n"
      "}\n"
      "$name$_ = NULL;\n");
  } else {
    printer->Print(variables_,
      "GOOGLE_DCHECK($name$_ != NULL);\n"
      "$name$_->$type$::Clear();\n");
  }
}